

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_MeshFace::IsPlanar
          (ON_MeshFace *this,double planar_tolerance,double angle_tolerance_radians,
          ON_3dPointListRef *vertex_list,ON_PlaneEquation *face_plane_equation)

{
  double dVar1;
  undefined8 uVar2;
  uint uVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  bool bVar8;
  ON_3dPoint P;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  ON_3dVector *this_00;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  ON_PlaneEquation e;
  ON_3dVector corner_normals [4];
  double local_e8;
  undefined8 uStack_c0;
  ON_PlaneEquation local_a8;
  ON_3dVector local_88 [2];
  double adStack_58 [6];
  
  ON_PlaneEquation::ON_PlaneEquation(&local_a8);
  bVar9 = GetPlaneEquation(this,vertex_list,&local_a8);
  dVar6 = ON_PlaneEquation::UnsetPlaneEquation.d;
  dVar1 = ON_PlaneEquation::UnsetPlaneEquation.y;
  dVar14 = ON_PlaneEquation::UnsetPlaneEquation.x;
  if (bVar9) {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = local_a8.z;
      face_plane_equation->d = local_a8.d;
      face_plane_equation->x = local_a8.x;
      face_plane_equation->y = local_a8.y;
    }
    bVar9 = true;
    if (this->vi[2] != this->vi[3]) {
      dVar14 = 0.0;
      if (0.0 <= planar_tolerance) {
        lVar11 = 0;
        local_e8 = 0.0;
        do {
          uVar3 = this->vi[lVar11 + 1];
          if (this->vi[lVar11] != uVar3) {
            dVar1 = -1.23432101234321e+308;
            dVar6 = -1.23432101234321e+308;
            dVar7 = -1.23432101234321e+308;
            if (-1 < (int)uVar3) {
              dVar1 = -1.23432101234321e+308;
              dVar6 = -1.23432101234321e+308;
              dVar7 = -1.23432101234321e+308;
              if (uVar3 < vertex_list->m_point_count) {
                pdVar4 = vertex_list->m_dP;
                if (pdVar4 == (double *)0x0) {
                  uVar10 = (ulong)(uVar3 * vertex_list->m_point_stride);
                  uVar2 = *(undefined8 *)(vertex_list->m_fP + uVar10);
                  dVar6 = (double)(float)uVar2;
                  dVar7 = (double)(float)((ulong)uVar2 >> 0x20);
                  dVar1 = (double)vertex_list->m_fP[uVar10 + 2];
                }
                else {
                  uVar10 = (ulong)(uVar3 * vertex_list->m_point_stride);
                  dVar6 = pdVar4[uVar10];
                  dVar7 = (pdVar4 + uVar10)[1];
                  dVar1 = pdVar4[uVar10 + 2];
                }
              }
            }
            auVar5._8_4_ = SUB84(dVar7,0);
            auVar5._0_8_ = dVar6;
            auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
            uStack_c0 = auVar5._8_8_;
            P.y = (double)uStack_c0;
            P.x = dVar6;
            P.z = dVar1;
            dVar1 = ON_PlaneEquation::ValueAt(&local_a8,P);
            if (dVar14 <= dVar1) {
              uVar12 = SUB84(dVar1,0);
              uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
              if (dVar1 <= local_e8) goto LAB_00503631;
            }
            else {
              uVar12 = SUB84(local_e8,0);
              uVar13 = (undefined4)((ulong)local_e8 >> 0x20);
              dVar14 = dVar1;
            }
            local_e8 = (double)CONCAT44(uVar13,uVar12);
            if (planar_tolerance < (double)CONCAT44(uVar13,uVar12) - dVar14) goto LAB_005036b6;
          }
LAB_00503631:
          lVar11 = lVar11 + 1;
        } while (lVar11 != 2);
      }
      if (0.0 <= angle_tolerance_radians) {
        GetCornerNormals(this,vertex_list,local_88);
        dVar14 = ON_3dVector::UnsetVector.x;
        if (3.141592653589793 <= angle_tolerance_radians) {
          uVar12 = 0;
          uVar13 = 0xbff00000;
        }
        else {
          dVar1 = cos(angle_tolerance_radians);
          uVar12 = SUB84(dVar1,0);
          uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        lVar11 = 2;
        this_00 = local_88;
        bVar9 = true;
        do {
          bVar8 = bVar9;
          if ((dVar14 != this_00->x) || (NAN(dVar14) || NAN(this_00->x))) {
            if ((dVar14 != local_88[lVar11].x) || (NAN(dVar14) || NAN(local_88[lVar11].x))) {
              dVar1 = ON_3dVector::operator*(this_00,local_88 + lVar11);
              if (dVar1 < (double)CONCAT44(uVar13,uVar12)) goto LAB_005036b6;
            }
          }
          lVar11 = 3;
          this_00 = local_88 + 1;
          bVar9 = false;
        } while (bVar8);
        bVar9 = true;
      }
    }
  }
  else {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = ON_PlaneEquation::UnsetPlaneEquation.z;
      face_plane_equation->d = dVar6;
      face_plane_equation->x = dVar14;
      face_plane_equation->y = dVar1;
    }
LAB_005036b6:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ON_MeshFace::IsPlanar( 
  double planar_tolerance,
  double angle_tolerance_radians,
  const class ON_3dPointListRef& vertex_list, 
  ON_PlaneEquation* face_plane_equation
  ) const
{
  ON_PlaneEquation e;

  for (;;)
  {
    if (!GetPlaneEquation(vertex_list, e))
      break;

    if ( face_plane_equation )
      *face_plane_equation = e;

    if (vi[2] == vi[3])
      return true; // triangle

    if (planar_tolerance >= 0.0)
    {
      double h0, h1, h;
      h0 = h1 = 0.0;
      for (int i = 1; i < 3; i++)
      {
        if (vi[i - 1] == vi[i])
          continue;
        h = e.ValueAt(vertex_list[vi[i]]);
        if (h < h0)
          h0 = h;
        else if (h > h1)
          h1 = h;
        else
          continue;
        if (h1 - h0 > planar_tolerance)
        {
          return false;
        }
      }
    }

    if (angle_tolerance_radians >= 0.0)
    {
      ON_3dVector corner_normals[4];
      GetCornerNormals(vertex_list, corner_normals);
      const double unset_x = ON_3dVector::UnsetVector.x;
      const double cos_atol = (angle_tolerance_radians < ON_PI) ? cos(angle_tolerance_radians) : -1.0;
      for (unsigned int i = 0; i < 2; i++)
      {
        if (unset_x != corner_normals[i].x && unset_x != corner_normals[i+2].x && corner_normals[i] * corner_normals[i+2] < cos_atol)
          return false;
      }
    }

    return true;
  }

  if (face_plane_equation)
    *face_plane_equation = ON_PlaneEquation::UnsetPlaneEquation;

  return false;
}